

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O2

void __thiscall
Memory::RecyclerSweep::
TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          *heapBucket)

{
  uint32 *puVar1;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint in_EAX;
  uint uVar5;
  undefined4 *puVar6;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail;
  anon_class_16_2_f79d628a fn;
  undefined8 uStack_38;
  uint32 count;
  
  uStack_38._0_4_ = in_EAX;
  bVar4 = IsBackground(this);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbe,"(!this->IsBackground())","!this->IsBackground()");
    if (!bVar4) goto LAB_006329ff;
    *puVar6 = 0;
  }
  bVar4 = HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
          ::IsAllocationStopped(heapBucket);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbf,"(!heapBucket->IsAllocationStopped())",
                       "!heapBucket->IsAllocationStopped()");
    if (!bVar4) goto LAB_006329ff;
    *puVar6 = 0;
  }
  HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
  VerifyHeapBlockCount(heapBucket,false);
  uVar5 = HeapBucket::GetMediumBucketIndex(&heapBucket->super_HeapBucket);
  if ((this->mediumFinalizableWithBarrierData).bucketData[uVar5].pendingSweepList !=
      (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xc3,"(bucketData.pendingSweepList == nullptr)",
                       "bucketData.pendingSweepList == nullptr");
    if (!bVar4) goto LAB_006329ff;
    *puVar6 = 0;
  }
  list = (this->mediumFinalizableWithBarrierData).bucketData[uVar5].pendingEmptyBlockList;
  pSVar2 = (this->mediumFinalizableWithBarrierData).bucketData[uVar5].pendingEmptyBlockListTail;
  if (list == (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    if (pSVar2 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xe2,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                         "bucketData.pendingEmptyBlockListTail == nullptr");
      if (!bVar4) {
LAB_006329ff:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  else {
    uStack_38 = (ulong)(uint)uStack_38;
    fn.count = (uint32 *)((long)&uStack_38 + 4);
    fn.tail = pSVar2;
    HeapBlockList::
    ForEach<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>,Memory::RecyclerSweep::TransferPendingEmptyHeapBlocks<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>(Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>*)::_lambda(Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>*)_1_>
              (list,fn);
    puVar1 = &(heapBucket->super_HeapBucket).emptyHeapBlockCount;
    *puVar1 = *puVar1 + uStack_38._4_4_;
    puVar1 = &(heapBucket->super_HeapBucket).heapBlockCount;
    *puVar1 = *puVar1 - uStack_38._4_4_;
    (pSVar2->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
    super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
    super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next =
         (SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBucket->emptyBlockList;
    heapBucket->emptyBlockList = list;
    (this->mediumFinalizableWithBarrierData).bucketData[uVar5].pendingEmptyBlockList =
         (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
    VerifyHeapBlockCount(heapBucket,false);
  }
  return;
}

Assistant:

void
RecyclerSweep::TransferPendingEmptyHeapBlocks(HeapBucketT<TBlockType> * heapBucket)
{
    Assert(!this->IsBackground());
    Assert(!heapBucket->IsAllocationStopped());
    RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));

    auto& bucketData = this->GetBucketData(heapBucket);
    Assert(bucketData.pendingSweepList == nullptr);
    TBlockType * list = bucketData.pendingEmptyBlockList;
    if (list)
    {
        TBlockType * tail = bucketData.pendingEmptyBlockListTail;
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        uint32 count = 0;
        HeapBlockList::ForEach(list, [tail, &count](TBlockType * heapBlock)
        {
            Assert(heapBlock->GetAddress() == nullptr);
            Assert(heapBlock->GetSegment() == nullptr);
            Assert(heapBlock->GetNextBlock() != nullptr || heapBlock == tail);
            count++;
        });
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        heapBucket->emptyHeapBlockCount += count;
#endif
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        heapBucket->heapBlockCount -= count;
#endif
#endif


        tail->SetNextBlock(heapBucket->emptyBlockList);
        heapBucket->emptyBlockList = list;

        bucketData.pendingEmptyBlockList = nullptr;
        RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));
    }
    else
    {
        Assert(bucketData.pendingEmptyBlockListTail == nullptr);
    }
}